

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O1

int __thiscall libDAI::MF::init(MF *this,EVP_PKEY_CTX *ctx)

{
  pointer pdVar1;
  pointer pTVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  pointer pTVar13;
  Exception *this_00;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  string local_40;
  
  iVar12 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar12 != '\0') {
    pTVar13 = (this->_beliefs).
              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->_beliefs).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar13 != pTVar2) {
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar17 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      do {
        pdVar3 = (pTVar13->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = (long)(pTVar13->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar3;
        if (lVar14 != 0) {
          lVar14 = lVar14 >> 3;
          auVar18 = vpbroadcastq_avx512f();
          uVar15 = 0;
          do {
            auVar19 = vpbroadcastq_avx512f();
            auVar19 = vporq_avx512f(auVar19,auVar16);
            uVar11 = vpcmpuq_avx512f(auVar19,auVar18,2);
            pdVar1 = pdVar3 + uVar15;
            bVar4 = (bool)((byte)uVar11 & 1);
            bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar4 * auVar17._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar6 * auVar17._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar7 * auVar17._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar8 * auVar17._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar9 * auVar17._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar10 * auVar17._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar11 >> 7) * auVar17._56_8_ |
                                (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar1[7]);
            uVar15 = uVar15 + 8;
          } while ((lVar14 + (ulong)(lVar14 == 0) + 7 & 0xfffffffffffffff8) != uVar15);
        }
        pTVar13 = pTVar13 + 1;
      } while (pTVar13 != pTVar2);
    }
    return (int)pTVar13;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mf.cpp, line 85","");
  Exception::Exception(this_00,8,&local_40);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MF::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator qi = _beliefs.begin(); qi != _beliefs.end(); qi++ )
            qi->fill(1.0);
    }